

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_square_matrix.h
# Opt level: O3

uchar __thiscall
sparse_square_matrix<unsigned_char>::get
          (sparse_square_matrix<unsigned_char> *this,uint32_t i,uint32_t j)

{
  uint uVar1;
  pointer puVar2;
  uchar uVar3;
  const_iterator cVar4;
  ulong local_10;
  
  uVar1 = this->N;
  if (uVar1 <= i) {
    __assert_fail("i < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/sparse_square_matrix.h"
                  ,0x39,
                  "const Ty sparse_square_matrix<unsigned char>::get(uint32_t, uint32_t) const [Ty = unsigned char]"
                 );
  }
  if (j < uVar1) {
    puVar2 = (this->denseStorage).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (puVar2 == (this->denseStorage).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      local_10 = (ulong)(uVar1 * i + j);
      cVar4 = std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_char>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->sparseStorage)._M_h,&local_10);
      if (cVar4.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_char>,_false>.
          _M_cur == (__node_type *)0x0) {
        uVar3 = '\0';
      }
      else {
        uVar3 = *(uchar *)((long)cVar4.
                                 super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_char>,_false>
                                 ._M_cur + 0x10);
      }
    }
    else {
      uVar3 = puVar2[uVar1 * i + j];
    }
    return uVar3;
  }
  __assert_fail("j < N",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/sparse_square_matrix.h"
                ,0x3a,
                "const Ty sparse_square_matrix<unsigned char>::get(uint32_t, uint32_t) const [Ty = unsigned char]"
               );
}

Assistant:

const Ty get(uint32_t i, uint32_t j) const {
    assert(i < N);
    assert(j < N);
    if (usingDenseStorage()) {
      return denseStorage[i * N + j];
    }
    auto iter = sparseStorage.find(i * N + j);
    return iter == sparseStorage.end() ? Ty() : iter->second;
  }